

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstree.cpp
# Opt level: O2

BSTNode * __thiscall search::BSTNode::forerunner(BSTNode *this)

{
  BSTNode *pBVar1;
  bool bVar2;
  
  if (this->left_ != (BSTNode *)0x0) {
    pBVar1 = max(this->left_);
    return pBVar1;
  }
  do {
    pBVar1 = this->parent_;
    if (pBVar1 == (BSTNode *)0x0) {
      return (BSTNode *)0x0;
    }
    bVar2 = pBVar1->left_ == this;
    this = pBVar1;
  } while (bVar2);
  return pBVar1;
}

Assistant:

BSTNode* BSTNode::forerunner()
    {
        if (left_)
            return left_->max();
        else
        {
            BSTNode* node = this;
            BSTNode* p = parent_;
            while (p && p->left_ == node)
            {
                // this is min of node
                node = p;
                p = node->parent_;
            }
            return p;
        }
    }